

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O2

tuple<unsigned_long,_unsigned_long> __thiscall Environment::Get(Environment *this,size_t symbol)

{
  iterator iVar1;
  ostream *poVar2;
  string *psVar3;
  size_t in_RDX;
  unsigned_long extraout_RDX;
  __normal_iterator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_*,_std::vector<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>_>
  __tmp;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  pointer puVar5;
  tuple<unsigned_long,_unsigned_long> tVar6;
  size_t local_38;
  size_t symbol_local;
  _Head_base<0UL,_unsigned_long,_false> _Var4;
  
  this_00 = *(_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              **)(symbol + 8);
  puVar5 = (pointer)0x0;
  local_38 = in_RDX;
  do {
    if (this_00 ==
        *(_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          **)symbol) {
      if (g_options.emit_warnings == true) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"warning: possibly unbound symbol: ");
        psVar3 = SymbolInterner::GetSymbol_abi_cxx11_(local_38);
        poVar2 = std::operator<<(poVar2,(string *)psVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      tVar6 = DefineGlobal(this,symbol);
      _Var4 = tVar6.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
              super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
LAB_00118ed3:
      tVar6.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = _Var4._M_head_impl;
      tVar6.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
      return (tuple<unsigned_long,_unsigned_long>)
             tVar6.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>;
    }
    this_00 = this_00 + -1;
    iVar1 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,&local_38);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      (this->slot_map).
      super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           *(pointer *)
            ((long)iVar1.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>,_false>
                   ._M_cur + 0x10);
      (this->slot_map).
      super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar5;
      _Var4._M_head_impl = extraout_RDX;
      goto LAB_00118ed3;
    }
    puVar5 = (pointer)((long)&(puVar5->_M_h)._M_buckets + 1);
  } while( true );
}

Assistant:

std::tuple<size_t, size_t> Environment::Get(size_t symbol) {
  // starting at the most recent lexical environment, search upwards
  // until we find what we're looking for.
  size_t up_index = 0;
  for (auto it = slot_map.rbegin(); it != slot_map.rend(); it++) {
    auto entry = it->find(symbol);
    if (entry != it->end()) {
      // we found it. the second entry of this map is the right_index
      return std::make_tuple(up_index, std::get<1>(entry->second));
    }

    up_index++;
  }

  if (g_options.emit_warnings) {
    std::cerr << "warning: possibly unbound symbol: "
              << SymbolInterner::GetSymbol(symbol) << std::endl;
  }

  return DefineGlobal(symbol);
}